

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Initialize(ImGuiContext *context)

{
  byte local_49;
  undefined1 local_48 [8];
  ImGuiSettingsHandler ini_handler;
  ImGuiContext *g;
  ImGuiContext *context_local;
  
  local_49 = 0;
  if ((context->Initialized & 1U) == 0) {
    local_49 = context->SettingsLoaded ^ 0xff;
  }
  ini_handler.UserData = context;
  if ((local_49 & 1) == 0) {
    __assert_fail("!g.Initialized && !g.SettingsLoaded",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xe91,"void ImGui::Initialize(ImGuiContext *)");
  }
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)local_48);
  local_48 = (undefined1  [8])0x23cf4d;
  ini_handler.TypeName._0_4_ = ImHash("Window",0,0);
  ini_handler._8_8_ = SettingsHandlerWindow_ReadOpen;
  ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadLine;
  ini_handler.ReadLineFn = SettingsHandlerWindow_WriteAll;
  ImVector<ImGuiSettingsHandler>::push_front
            ((ImVector<ImGuiSettingsHandler> *)((long)ini_handler.UserData + 0x2aa0),
             (value_type *)local_48);
  *(undefined1 *)ini_handler.UserData = 1;
  return;
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Window";
    ini_handler.TypeHash = ImHash("Window", 0, 0);
    ini_handler.ReadOpenFn = SettingsHandlerWindow_ReadOpen;
    ini_handler.ReadLineFn = SettingsHandlerWindow_ReadLine;
    ini_handler.WriteAllFn = SettingsHandlerWindow_WriteAll;
    g.SettingsHandlers.push_front(ini_handler);

    g.Initialized = true;
}